

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O3

int si9ma::DP::find_way_dp(int *arr,int length,int start,int aim,int step)

{
  long lVar1;
  size_t __n;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  void *pvVar8;
  void *__s;
  void *__s_00;
  bool bVar9;
  undefined8 uStack_50;
  undefined8 local_48;
  size_t local_40;
  uint local_38;
  uint local_34;
  
  local_48 = &local_48;
  iVar2 = 0;
  iVar6 = 0;
  if ((((-1 < start && arr != (int *)0x0) && (iVar6 = iVar2, aim < length)) && (start < length)) &&
     (-1 < aim)) {
    uVar7 = (ulong)(uint)length;
    uVar4 = uVar7 * 4 + 0xf & 0xfffffffffffffff0;
    lVar1 = -uVar4;
    __s = (void *)((long)&local_48 + lVar1);
    __s_00 = (void *)((long)__s - uVar4);
    local_40 = uVar7 * 4;
    local_38 = aim;
    local_34 = start;
    *(undefined8 *)((long)__s_00 + -8) = 0x10e576;
    memset(__s,0,uVar7 * 4);
    __n = local_40;
    *(undefined8 *)((long)__s_00 + -8) = 0x10e584;
    memset(__s_00,0,__n);
    *(undefined4 *)((long)__s + (ulong)local_38 * 4) = 1;
    if (0 < step) {
      uVar4 = (ulong)(length - 1);
      uVar3 = 1;
      do {
        uVar5 = 0;
        do {
          if ((uVar3 & 1) == 0) {
            pvVar8 = __s;
            if (uVar5 == 0) {
              iVar6 = *(int *)((long)__s_00 + 4);
            }
            else if (uVar4 == uVar5) {
              iVar6 = *(int *)((long)__s_00 + uVar4 * 4 + -4);
            }
            else {
              iVar6 = *(int *)((long)__s_00 + uVar5 * 4 + 4) +
                      *(int *)((long)__s_00 + uVar5 * 4 + -4);
            }
          }
          else {
            pvVar8 = __s_00;
            if (uVar5 == 0) {
              iVar6 = *(int *)((long)&local_48 + lVar1 + 4);
            }
            else if (uVar4 == uVar5) {
              iVar6 = *(int *)((long)&uStack_50 + uVar4 * 4 + lVar1 + 4);
            }
            else {
              iVar6 = *(int *)((long)&local_48 + uVar5 * 4 + lVar1 + 4) +
                      *(int *)((long)&uStack_50 + uVar5 * 4 + lVar1 + 4);
            }
          }
          *(int *)((long)pvVar8 + uVar5 * 4) = iVar6;
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
        bVar9 = uVar3 != step;
        uVar3 = uVar3 + 1;
      } while (bVar9);
      if ((step & 1U) != 0) {
        __s = __s_00;
      }
    }
    iVar6 = *(int *)((long)__s + (ulong)local_34 * 4);
  }
  return iVar6;
}

Assistant:

int DP::find_way_dp(int *arr, int length, int start, int aim, int step) {
        if(arr == nullptr || start < 0 || start >= length || aim < 0 || aim >= length)
            return 0;

        int res_arr[length];
        int res_arr_tmp[length];
        memset(res_arr,0, length*sizeof(res_arr[0]));
        memset(res_arr_tmp,0, length*sizeof(res_arr_tmp[0]));

        res_arr[aim] = 1;
        bool tmp_is_main = true;
        for (int i = 1; i <= step ; ++i) {
            for (int j = 0; j < length ; ++j) {
                if (tmp_is_main)
                    res_arr_tmp[j] = j == 0 ? res_arr[j + 1]
                                            : (j == length - 1 ? res_arr[j - 1] : res_arr[j - 1] + res_arr[j + 1]);
                else
                    res_arr[j] = j == 0 ? res_arr_tmp[j + 1]
                                        : (j == length - 1 ? res_arr_tmp[j - 1] : res_arr_tmp[j - 1] + res_arr_tmp[j + 1]);
            }
            tmp_is_main = !tmp_is_main;
        }

        return tmp_is_main ? res_arr[start] : res_arr_tmp[start];
    }